

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O0

void __thiscall TPZGenGrid2D::SetPointBC(TPZGenGrid2D *this,TPZGeoMesh *gr,TPZVec<double> *x,int bc)

{
  int i;
  TPZGeoNode *pTVar1;
  TPZAdmChunkVector<TPZGeoEl_*,_10> *this_00;
  int64_t nelem_00;
  TPZGeoEl **ppTVar2;
  TPZGeoMesh *in_RSI;
  TPZGeoNode *gn;
  int c;
  int nc;
  TPZGeoEl *gel;
  int64_t nelem;
  int64_t iel;
  TPZGeoNode *gn1;
  TPZGeoNode *in_stack_ffffffffffffffb0;
  int iVar3;
  TPZGeoEl *this_01;
  TPZChunkVector<TPZGeoEl_*,_10> *this_02;
  
  pTVar1 = TPZGeoMesh::FindNode((TPZGeoMesh *)iel,(TPZVec<double> *)nelem);
  this_00 = TPZGeoMesh::ElementVec(in_RSI);
  nelem_00 = TPZChunkVector<TPZGeoEl_*,_10>::NElements
                       (&this_00->super_TPZChunkVector<TPZGeoEl_*,_10>);
  this_02 = (TPZChunkVector<TPZGeoEl_*,_10> *)0x0;
  do {
    if (nelem_00 <= (long)this_02) {
      return;
    }
    TPZGeoMesh::ElementVec(in_RSI);
    ppTVar2 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](this_02,nelem_00);
    this_01 = *ppTVar2;
    if (this_01 != (TPZGeoEl *)0x0) {
      i = (**(code **)(*(long *)this_01 + 0x98))();
      iVar3 = 0;
      while ((iVar3 < i &&
             (in_stack_ffffffffffffffb0 = TPZGeoEl::NodePtr(this_01,i),
             in_stack_ffffffffffffffb0 != pTVar1))) {
        iVar3 = iVar3 + 1;
      }
      if (iVar3 < i) {
        TPZGeoElBC::TPZGeoElBC
                  ((TPZGeoElBC *)this_01,(TPZGeoEl *)CONCAT44(i,iVar3),
                   (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0);
        return;
      }
    }
    this_02 = (TPZChunkVector<TPZGeoEl_*,_10> *)
              ((long)&(this_02->super_TPZSavable)._vptr_TPZSavable + 1);
  } while( true );
}

Assistant:

void TPZGenGrid2D::SetPointBC(TPZGeoMesh *gr, TPZVec<REAL> &x, int bc) {
    // look for an element/corner node whose distance is close to start
    TPZGeoNode *gn1 = gr->FindNode(x);
    int64_t iel;
    int64_t nelem = gr->ElementVec().NElements();
    TPZGeoEl *gel;
    for (iel = 0; iel < nelem; iel++) {
        gel = gr->ElementVec()[iel];
        if (!gel) continue;
        int nc = gel->NCornerNodes();
        int c;
        for (c = 0; c < nc; c++) {
            TPZGeoNode *gn = gel->NodePtr(c);
            if (gn == gn1) {
                break;
            }
        }
        if (c < nc) {
            TPZGeoElBC(gel, c, bc);
            return;
        }
    }
}